

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::getDerefTypeId(Builder *this,Id resultId)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  ulong uVar3;
  
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[resultId];
  if (pIVar2 == (Instruction *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)pIVar2->typeId;
  }
  pIVar2 = ppIVar1[uVar3];
  if (pIVar2->opCode == OpTypePointer) {
    if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 2) != 0) {
      return *(Id *)(*(long *)&(pIVar2->operands).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 4);
    }
    __assert_fail("idOperand[op]",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
  }
  __assert_fail("isPointerType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x546,"Id spv::Builder::getDerefTypeId(Id) const");
}

Assistant:

Id Builder::getDerefTypeId(Id resultId) const
{
    Id typeId = getTypeId(resultId);
    assert(isPointerType(typeId));

    return module.getInstruction(typeId)->getIdOperand(1);
}